

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatSolverSearch.c
# Opt level: O0

void Msat_SolverReduceDB(Msat_Solver_t *p)

{
  double dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Msat_Clause_t **ppMVar5;
  float fVar6;
  double dExtraLim;
  int local_20;
  int j;
  int i;
  int nLearned;
  Msat_Clause_t **pLearned;
  Msat_Solver_t *p_local;
  
  dVar1 = p->dClaInc;
  iVar2 = Msat_ClauseVecReadSize(p->vLearned);
  Msat_SolverSortDB(p);
  iVar3 = Msat_ClauseVecReadSize(p->vLearned);
  ppMVar5 = Msat_ClauseVecReadArray(p->vLearned);
  dExtraLim._4_4_ = 0;
  for (local_20 = 0; local_20 < iVar3 / 2; local_20 = local_20 + 1) {
    iVar4 = Msat_ClauseIsLocked(p,ppMVar5[local_20]);
    if (iVar4 == 0) {
      Msat_ClauseFree(p,ppMVar5[local_20],1);
    }
    else {
      ppMVar5[dExtraLim._4_4_] = ppMVar5[local_20];
      dExtraLim._4_4_ = dExtraLim._4_4_ + 1;
    }
  }
  for (; local_20 < iVar3; local_20 = local_20 + 1) {
    iVar4 = Msat_ClauseIsLocked(p,ppMVar5[local_20]);
    if ((iVar4 != 0) ||
       (fVar6 = Msat_ClauseReadActivity(ppMVar5[local_20]), dVar1 / (double)iVar2 <= (double)fVar6))
    {
      ppMVar5[dExtraLim._4_4_] = ppMVar5[local_20];
      dExtraLim._4_4_ = dExtraLim._4_4_ + 1;
    }
    else {
      Msat_ClauseFree(p,ppMVar5[local_20],1);
    }
  }
  Msat_ClauseVecShrink(p->vLearned,dExtraLim._4_4_);
  return;
}

Assistant:

void Msat_SolverReduceDB( Msat_Solver_t * p )
{
    Msat_Clause_t ** pLearned;
    int nLearned, i, j;
    double dExtraLim = p->dClaInc / Msat_ClauseVecReadSize(p->vLearned); 
    // Remove any clause below this activity

    // sort the learned clauses in the increasing order of activity
    Msat_SolverSortDB( p );

    // discard the first half the clauses (the less active ones)
    nLearned = Msat_ClauseVecReadSize( p->vLearned );
    pLearned = Msat_ClauseVecReadArray( p->vLearned );
    for ( i = j = 0; i < nLearned / 2; i++ )
        if ( !Msat_ClauseIsLocked( p, pLearned[i]) )
            Msat_ClauseFree( p, pLearned[i], 1 );
        else
            pLearned[j++] = pLearned[i];
    // filter the more active clauses and leave those above the limit
    for (  ; i < nLearned; i++ )
        if ( !Msat_ClauseIsLocked( p, pLearned[i] ) && 
            Msat_ClauseReadActivity(pLearned[i]) < dExtraLim )
            Msat_ClauseFree( p, pLearned[i], 1 );
        else
            pLearned[j++] = pLearned[i];
    Msat_ClauseVecShrink( p->vLearned, j );
}